

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkSetMaxCFailGrowth(void *arkode_mem,realtype etacf)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = etacf;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetMaxCFailGrowth",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->etacf =
         (realtype)
         (-(ulong)(local_18 <= 0.0) & 0x3fd0000000000000 |
         ~-(ulong)(local_18 <= 0.0) &
         (~-(ulong)(1.0 < local_18) & (ulong)local_18 |
         -(ulong)(1.0 < local_18) & 0x3fd0000000000000));
  }
  return iVar1;
}

Assistant:

int arkSetMaxCFailGrowth(void *arkode_mem, realtype etacf)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetMaxCFailGrowth",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if ((etacf <= ZERO) || (etacf > ONE)) {
    hadapt_mem->etacf = ETACF;
  } else {
    hadapt_mem->etacf = etacf;
  }

  return(ARK_SUCCESS);
}